

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger container_update(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  HSQUIRRELVM in_RDI;
  SQObjectType argType;
  int arg;
  SQInteger top;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  SQInteger in_stack_00000068;
  SQInteger in_stack_00000070;
  SQInteger in_stack_00000078;
  SQVM *in_stack_00000080;
  SQChar *in_stack_ffffffffffffffd8;
  SQObjectType in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  SQRESULT local_8;
  
  pSVar1 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (SQInteger)in_stack_ffffffffffffffd8);
  if (((pSVar1->super_SQObject)._flags & 1) == 0) {
    SVar2 = sq_gettop(in_RDI);
    for (iVar4 = 2; iVar4 <= SVar2; iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffffe0 =
           sq_gettype((HSQUIRRELVM)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                      (SQInteger)in_stack_ffffffffffffffd8);
      if ((in_stack_ffffffffffffffe0 & 0xc020) == 0) {
        SQVM::Raise_ParamTypeError
                  (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
        return -1;
      }
      sq_pushnull((HSQUIRRELVM)0x127526);
      while (SVar3 = sq_next(in_stack_00000058,in_stack_00000050), -1 < SVar3) {
        sq_newslot(v,top,_argType);
      }
      sq_pop((HSQUIRRELVM)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
             (SQInteger)in_stack_ffffffffffffffd8);
    }
    sq_push((HSQUIRRELVM)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
            (SQInteger)in_stack_ffffffffffffffd8);
    local_8 = 1;
  }
  else {
    local_8 = sq_throwerror((HSQUIRRELVM)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

static SQInteger container_update(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQInteger top = sq_gettop(v);
    for (int arg=2; arg<=top; ++arg) {
        SQObjectType argType = sq_gettype(v, arg);
        if (!(argType & (_RT_TABLE | _RT_CLASS | _RT_INSTANCE))) {
            v->Raise_ParamTypeError(arg, _RT_TABLE | _RT_CLASS | _RT_INSTANCE, argType);
            return SQ_ERROR;
        }

        sq_pushnull(v);
        while (SQ_SUCCEEDED(sq_next(v, arg))) {
            sq_newslot(v, 1, false);
        }
        sq_pop(v, 1); // pops the iterator
    }
    sq_push(v, 1);
    return 1;
}